

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

void do_incbin(int *ip)

{
  t_symbol *ptVar1;
  int iVar2;
  char *__s;
  char *pcVar3;
  FILE *__stream;
  long lVar4;
  char fname [128];
  char acStack_a8 [128];
  
  iVar2 = getstring(ip,acStack_a8,0x7f);
  if (iVar2 == 0) {
    return;
  }
  __s = strrchr(acStack_a8,0x2e);
  if ((__s != (char *)0x0) && (pcVar3 = strchr(__s,0x2f), pcVar3 == (char *)0x0)) {
    iVar2 = strcasecmp(__s,".mx");
    if (iVar2 == 0) {
      do_mx(acStack_a8);
      return;
    }
    iVar2 = strcasecmp(__s,".fmp");
    if ((iVar2 == 0) && (iVar2 = pce_load_map(acStack_a8,0), iVar2 != 0)) {
      return;
    }
  }
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  __stream = (FILE *)open_file(acStack_a8,"rb");
  if (__stream == (FILE *)0x0) {
    fatal_error("Can not open file!");
  }
  else {
    fseek(__stream,0,2);
    lVar4 = ftell(__stream);
    fseek(__stream,0,0);
    iVar2 = (int)lVar4;
    if (rom_limit < bank * 0x2000 + loccnt + iVar2) {
      fclose(__stream);
      error("ROM overflow!");
    }
    else {
      if (pass == 1) {
        fread(rom[bank] + loccnt,1,(long)iVar2,__stream);
        memset(map[bank] + loccnt,page * 0x20 + section,(long)iVar2);
        println();
      }
      fclose(__stream);
      ptVar1 = lablptr;
      bank = (loccnt + iVar2 >> 0xd) + bank;
      loccnt = loccnt + iVar2 & 0x1fff;
      if (max_bank < bank) {
        max_bank = bank - (uint)(loccnt == 0);
      }
      if (lablptr == (t_symbol *)0x0) {
        if ((lastlabl != (t_symbol *)0x0) && (lastlabl->data_type == 7)) {
          lastlabl->data_size = lastlabl->data_size + iVar2;
        }
      }
      else {
        lablptr->data_type = 7;
        ptVar1->data_size = iVar2;
      }
    }
  }
  return;
}

Assistant:

void
do_incbin(int *ip)
{
	FILE *fp;
	char *p;
	char fname[128];
	int  size;

	/* get file name */
	if (!getstring(ip, fname, 127))
		return;

	/* get file extension */
	if ((p = strrchr(fname, '.')) != NULL) {
		if (!strchr(p, PATH_SEPARATOR)) {
			/* check if it's a mx file */
			if (!strcasecmp(p, ".mx")) {
				do_mx(fname);
				return;
			}
			/* check if it's a map file */
			if (!strcasecmp(p, ".fmp")) {
				if (pce_load_map(fname, 0))
					return;
			}
		}
	}

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* open file */
	if ((fp = open_file(fname, "rb")) == NULL) {
		fatal_error("Can not open file!");
		return;
	}

	/* get file size */
	fseek(fp, 0, SEEK_END);
	size = ftell(fp);
	fseek(fp, 0, SEEK_SET);

	/* check if it will fit in the rom */
	if (((bank << 13) + loccnt + size) > rom_limit) {
		fclose(fp);
		error("ROM overflow!");
		return;
	}

	/* load data on last pass */
	if (pass == LAST_PASS) {
		fread(&rom[bank][loccnt], 1, size, fp);
		memset(&map[bank][loccnt], section + (page << 5), size);

		/* output line */
		println();
	}

	/* close file */
	fclose(fp);

	/* update bank and location counters */
	bank  += (loccnt + size) >> 13;
	loccnt = (loccnt + size) & 0x1FFF;
	if (bank > max_bank) {
		if (loccnt)
			max_bank = bank;
		else
			max_bank = bank - 1;
	}

	/* size */
	if (lablptr) {
		lablptr->data_type = P_INCBIN;
		lablptr->data_size = size;
	}
	else {
		if (lastlabl) {
			if (lastlabl->data_type == P_INCBIN)
				lastlabl->data_size += size;
		}
	}
}